

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O2

void Assimp::GetArrayCopy<aiQuatKey>(aiQuatKey **dest,ai_uint num)

{
  aiQuatKey *__src;
  aiQuatKey *__dest;
  aiQuatKey *paVar1;
  ulong __n;
  
  __src = *dest;
  if (__src != (aiQuatKey *)0x0) {
    __n = (ulong)num * 0x18;
    __dest = (aiQuatKey *)operator_new__(__n);
    if (num != 0) {
      paVar1 = __dest;
      do {
        paVar1->mTime = 0.0;
        (paVar1->mValue).w = 1.0;
        (paVar1->mValue).x = 0.0;
        (paVar1->mValue).y = 0.0;
        (paVar1->mValue).z = 0.0;
        paVar1 = paVar1 + 1;
      } while (paVar1 != __dest + num);
    }
    *dest = __dest;
    memcpy(__dest,__src,__n);
    return;
  }
  return;
}

Assistant:

inline
void GetArrayCopy(Type*& dest, ai_uint num ) {
    if ( !dest ) {
        return;
    }
    Type* old = dest;

    dest = new Type[num];
    ::memcpy(dest, old, sizeof(Type) * num);
}